

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

void nullcDumpStackData(void)

{
  uint uVar1;
  int iVar2;
  ExternFuncInfo *codeFunctions_00;
  ExternLocalInfo *pEVar3;
  char *pcVar4;
  ExternFuncInfo *pEVar5;
  ExternTypeInfo *pEVar6;
  undefined8 *puVar7;
  uint uVar8;
  int local_4d4;
  ExternTypeInfo *type;
  uint i_1;
  char *ptr_1;
  char *ptr;
  ExternTypeInfo *localType;
  ExternLocalInfo *lInfo_1;
  uint i;
  uint stackSize;
  uint argumentsSize;
  ExternLocalInfo *lInfo;
  uint arg;
  int alignOffset;
  ExternFuncInfo *function;
  uint indent;
  ExternFuncInfo *func;
  char buf [1024];
  uint local_5c;
  uint address;
  uint offset;
  char *codeSymbols;
  ExternLocalInfo *codeLocals;
  ExternFuncInfo *codeFunctions;
  ExternTypeInfo *pEStack_38;
  uint functionCount;
  ExternTypeInfo *codeTypes;
  ExternVarInfo *pEStack_28;
  uint codeTypeCount;
  ExternVarInfo *codeVars;
  void *pvStack_18;
  uint variableCount;
  char *data;
  uint dataCount;
  
  data._4_4_ = 0xffffffff;
  pvStack_18 = nullcGetVariableData((uint *)((long)&data + 4));
  codeVars._4_4_ = 0;
  pEStack_28 = nullcDebugVariableInfo((uint *)((long)&codeVars + 4));
  codeTypes._4_4_ = 0;
  pEStack_38 = nullcDebugTypeInfo((uint *)((long)&codeTypes + 4));
  codeFunctions._4_4_ = 0;
  codeFunctions_00 = nullcDebugFunctionInfo((uint *)((long)&codeFunctions + 4));
  pEVar3 = nullcDebugLocalInfo((uint *)0x0);
  pcVar4 = nullcDebugSymbols((uint *)0x0);
  local_5c = 0;
  nullcDebugBeginCallStack();
  while (uVar1 = nullcDebugGetStackFrame(), uVar1 != 0) {
    PrintStackFrame(uVar1,(char *)&func,0x400,false);
    printf("%s",&func);
    pEVar5 = nullcDebugConvertAddressToFunction(uVar1,codeFunctions_00,codeFunctions._4_4_);
    if (pEVar5 == (ExternFuncInfo *)0x0) {
      for (type._4_4_ = 0; type._4_4_ < codeVars._4_4_; type._4_4_ = type._4_4_ + 1) {
        pEVar6 = pEStack_38 + pEStack_28[type._4_4_].type;
        nullcPrintDepthIndent(1);
        printf("%p: %s %s",(long)pvStack_18 + (ulong)pEStack_28[type._4_4_].offset,
               pcVar4 + pEVar6->offsetToName,pcVar4 + pEStack_28[type._4_4_].offsetToName);
        if ((pEVar6->subCat == CAT_NONE) || (pEVar6->subCat == CAT_POINTER)) {
          printf(" = ");
          nullcPrintBasicVariableInfo
                    (pEVar6,(char *)((long)pvStack_18 + (ulong)pEStack_28[type._4_4_].offset));
          printf("\n");
        }
        else {
          iVar2 = strcmp(pcVar4 + pEVar6->offsetToName,"typeid");
          if (iVar2 == 0) {
            printf(" = %s\n",
                   pcVar4 + pEStack_38
                            [*(int *)((long)pvStack_18 + (ulong)pEStack_28[type._4_4_].offset)].
                            offsetToName);
          }
          else {
            printf("\n");
            nullcPrintVariableInfo
                      (pEVar6,(char *)((long)pvStack_18 + (ulong)pEStack_28[type._4_4_].offset),2);
          }
        }
        if (local_5c < pEStack_28[type._4_4_].offset + pEVar6->size) {
          local_5c = pEStack_28[type._4_4_].offset + pEVar6->size;
        }
      }
    }
    else {
      if ((local_5c & 0xf) == 0) {
        local_4d4 = 0;
      }
      else {
        local_4d4 = 0x10 - (local_5c & 0xf);
      }
      local_5c = local_4d4 + local_5c;
      printf("%p: function %s(",(long)pvStack_18 + (ulong)local_5c,pcVar4 + pEVar5->offsetToName);
      for (lInfo._0_4_ = 0; (uint)lInfo < pEVar5->paramCount; lInfo._0_4_ = (uint)lInfo + 1) {
        uVar1 = pEVar5->offsetToFirstLocal + (uint)lInfo;
        printf("%s %s",pcVar4 + pEStack_38[pEVar3[uVar1].type].offsetToName,
               pcVar4 + pEVar3[uVar1].offsetToName);
        if ((uint)lInfo != pEVar5->paramCount - 1) {
          printf(", ");
        }
      }
      uVar1 = pEVar5->stackSize + 0xf & 0xfffffff0;
      printf(") argument size %u, stack size %u\n",(ulong)pEVar5->argumentSize,(ulong)uVar1);
      for (lInfo_1._4_4_ = 0; lInfo_1._4_4_ < pEVar5->localCount; lInfo_1._4_4_ = lInfo_1._4_4_ + 1)
      {
        uVar8 = pEVar5->offsetToFirstLocal + lInfo_1._4_4_;
        pEVar6 = pEStack_38 + pEVar3[uVar8].type;
        nullcPrintDepthIndent(1);
        printf("%p: %s %s",(long)pvStack_18 + (ulong)pEVar3[uVar8].offset + (ulong)local_5c,
               pcVar4 + pEStack_38[pEVar3[uVar8].type].offsetToName,
               pcVar4 + pEVar3[uVar8].offsetToName);
        if ((pEVar6->subCat == CAT_NONE) || (pEVar6->subCat == CAT_POINTER)) {
          printf(" = ");
          nullcPrintBasicVariableInfo
                    (pEVar6,(char *)((long)pvStack_18 +
                                    (ulong)pEVar3[uVar8].offset + (ulong)local_5c));
          printf("\n");
        }
        else {
          iVar2 = strcmp(pcVar4 + pEVar6->offsetToName,"typeid");
          if (iVar2 == 0) {
            printf(" = %s\n",
                   pcVar4 + pEStack_38
                            [*(int *)((long)pvStack_18 +
                                     (ulong)pEVar3[uVar8].offset + (ulong)local_5c)].offsetToName);
          }
          else {
            printf("\n");
            nullcPrintVariableInfo
                      (pEVar6,(char *)((long)pvStack_18 +
                                      (ulong)pEVar3[uVar8].offset + (ulong)local_5c),2);
          }
        }
      }
      if (pEVar5->parentType != 0xffffffff) {
        puVar7 = (undefined8 *)
                 ((long)pvStack_18 + (ulong)pEVar5->argumentSize + (ulong)local_5c + -8);
        nullcPrintDepthIndent(1);
        printf("%p: %s %s = %p\n",puVar7,"$this",
               pcVar4 + pEStack_38[pEVar5->parentType].offsetToName,*puVar7);
      }
      if (pEVar5->contextType != 0xffffffff) {
        puVar7 = (undefined8 *)
                 ((long)pvStack_18 + (ulong)pEVar5->argumentSize + (ulong)local_5c + -8);
        nullcPrintDepthIndent(1);
        printf("%p: %s %s = %p\n",puVar7,"$context",
               pcVar4 + pEStack_38[pEVar5->contextType].offsetToName,*puVar7);
      }
      local_5c = uVar1 + local_5c;
    }
  }
  return;
}

Assistant:

void nullcDumpStackData()
{
	unsigned dataCount = ~0u;
	char *data = (char*)nullcGetVariableData(&dataCount);

	unsigned variableCount = 0;
	ExternVarInfo *codeVars = nullcDebugVariableInfo(&variableCount);

	unsigned codeTypeCount = 0;
	ExternTypeInfo *codeTypes = nullcDebugTypeInfo(&codeTypeCount);

	unsigned functionCount = 0;
	ExternFuncInfo *codeFunctions = nullcDebugFunctionInfo(&functionCount);

	ExternLocalInfo *codeLocals = nullcDebugLocalInfo(NULL);
	char *codeSymbols = nullcDebugSymbols(NULL);

	unsigned offset = 0;

	nullcDebugBeginCallStack();
	while(unsigned address = nullcDebugGetStackFrame())
	{
		char buf[1024];
		PrintStackFrame(address, buf, 1024, false);

		printf("%s", buf);

		ExternFuncInfo *func = nullcDebugConvertAddressToFunction(address, codeFunctions, functionCount);

		unsigned indent = 1;

		if(func)
		{
			ExternFuncInfo &function = *func;

			// Align offset to the first variable (by 16 byte boundary)
			int alignOffset = (offset % 16 != 0) ? (16 - (offset % 16)) : 0;
			offset += alignOffset;

			printf("%p: function %s(", (void*)(data + offset), codeSymbols + function.offsetToName);
			for(unsigned arg = 0; arg < function.paramCount; arg++)
			{
				ExternLocalInfo &lInfo = codeLocals[function.offsetToFirstLocal + arg];
				printf("%s %s", codeSymbols + codeTypes[lInfo.type].offsetToName, codeSymbols + lInfo.offsetToName);
				if(arg != function.paramCount - 1)
					printf(", ");
			}

			unsigned argumentsSize = function.argumentSize;
			unsigned stackSize = (function.stackSize + 0xf) & ~0xf;

			printf(") argument size %u, stack size %u\n", argumentsSize, stackSize);

			for(unsigned i = 0; i < function.localCount; i++)
			{
				ExternLocalInfo &lInfo = codeLocals[function.offsetToFirstLocal + i];
				ExternTypeInfo &localType = codeTypes[lInfo.type];

				nullcPrintDepthIndent(indent);
				printf("%p: %s %s", (void*)(data + offset + lInfo.offset), codeSymbols + codeTypes[lInfo.type].offsetToName, codeSymbols + lInfo.offsetToName);

				if(localType.subCat == ExternTypeInfo::CAT_NONE || localType.subCat == ExternTypeInfo::CAT_POINTER)
				{
					printf(" = ");
					nullcPrintBasicVariableInfo(localType, data + offset + lInfo.offset);
					printf("\n");
				}
				else if(strcmp(codeSymbols + localType.offsetToName, "typeid") == 0)
				{
					printf(" = %s\n", codeSymbols + codeTypes[*(int*)(data + offset + lInfo.offset)].offsetToName);
				}
				else
				{
					printf("\n");
					nullcPrintVariableInfo(localType, data + offset + lInfo.offset, indent + 1);
				}
			}

			if(function.parentType != ~0u)
			{
				char *ptr = (char*)(data + offset + function.argumentSize - NULLC_PTR_SIZE);

				nullcPrintDepthIndent(indent);
				printf("%p: %s %s = %p\n", (void*)ptr, "$this", codeSymbols + codeTypes[function.parentType].offsetToName, *(void**)ptr);
			}

			if(function.contextType != ~0u)
			{
				char *ptr = (char*)(data + offset + function.argumentSize - NULLC_PTR_SIZE);

				nullcPrintDepthIndent(indent);
				printf("%p: %s %s = %p\n", (void*)ptr, "$context", codeSymbols + codeTypes[function.contextType].offsetToName, *(void**)ptr);
			}

			offset += stackSize;
		}
		else
		{
			for(unsigned i = 0; i < variableCount; i++)
			{
				ExternTypeInfo &type = codeTypes[codeVars[i].type];

				nullcPrintDepthIndent(indent);
				printf("%p: %s %s", (void*)(data + codeVars[i].offset), codeSymbols + type.offsetToName, codeSymbols + codeVars[i].offsetToName);

				if(type.subCat == ExternTypeInfo::CAT_NONE || type.subCat == ExternTypeInfo::CAT_POINTER)
				{
					printf(" = ");
					nullcPrintBasicVariableInfo(type, data + codeVars[i].offset);
					printf("\n");
				}
				else if(strcmp(codeSymbols + type.offsetToName, "typeid") == 0)
				{
					printf(" = %s\n", codeSymbols + codeTypes[*(int*)(data + codeVars[i].offset)].offsetToName);
				}
				else
				{
					printf("\n");
					nullcPrintVariableInfo(type, data + codeVars[i].offset, indent + 1);
				}

				if(codeVars[i].offset + type.size > offset)
					offset = codeVars[i].offset + type.size;
			}
		}
	}
}